

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOManager.cpp
# Opt level: O2

Mat * IOManager::secret_share_ngram(int *data,int size,string *prefix)

{
  undefined1 v [16];
  ostream *poVar1;
  undefined8 *puVar2;
  ll lVar3;
  ulong uVar4;
  Mat *pMVar5;
  Mat *pMVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  vector<long_long,_std::allocator<long_long>_> coefficients;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  out_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string filename;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Vector_base<long_long,_std::allocator<long_long>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar8 = (ulong)(uint)size;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&coefficients,2,(allocator_type *)&filename);
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::vector(&out_files,3,(allocator_type *)&filename);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)prefix);
  poVar1 = std::operator<<(poVar1," size: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)uVar8);
  std::endl<char,std::char_traits<char>>(poVar1);
  puVar2 = (undefined8 *)operator_new__(0x80);
  *puVar2 = 3;
  pMVar5 = (Mat *)(puVar2 + 1);
  lVar9 = 0;
  pMVar6 = pMVar5;
  do {
    Mat::Mat(pMVar5);
    lVar9 = lVar9 + -0x28;
    pMVar5 = pMVar5 + 1;
  } while (lVar9 != -0x78);
  lVar10 = 0;
  pMVar5 = pMVar6;
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    Mat::init(pMVar6,(EVP_PKEY_CTX *)0x1);
    std::operator+(&local_88,"output/",prefix);
    std::operator+(&local_e8,&local_88,"_");
    std::__cxx11::to_string(&local_a8,(int)lVar9);
    std::operator+(&local_50,&local_e8,&local_a8);
    std::operator+(&filename,&local_50,".csv");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
    poVar1 = std::operator<<((ostream *)&std::cout,"File: ");
    poVar1 = std::operator<<(poVar1,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ofstream::open((string *)
                        (out_files.
                         super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar10),
                        (_Ios_Openmode)&filename);
    std::__cxx11::string::~string((string *)&filename);
    pMVar6 = pMVar6 + 1;
    lVar10 = lVar10 + 0x200;
  }
  lVar3 = Constant::Util::randomlong();
  coefficients.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = lVar3;
  poVar1 = std::operator<<((ostream *)&std::cout,"Size: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)uVar8);
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar7 = 0;
  uVar4 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar4 = uVar7;
  }
  for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    lVar3 = Constant::Util::randomlong();
    coefficients.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start[1] = lVar3;
    *coefficients.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
     super__Vector_impl_data._M_start = (long)data[uVar7] << 0x14;
    lVar10 = 0;
    pMVar6 = pMVar5;
    for (lVar9 = 2; lVar9 != 5; lVar9 = lVar9 + 1) {
      std::vector<long_long,_std::allocator<long_long>_>::vector
                ((vector<long_long,_std::allocator<long_long>_> *)&local_68,&coefficients);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&local_68);
      poVar1 = std::ostream::_M_insert<long_long>
                         ((longlong)
                          (out_files.
                           super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar10));
      std::operator<<(poVar1,",");
      v._8_8_ = pMVar6;
      v._0_8_ = uVar4;
      Mat::setVal(pMVar5,(int)uVar7,(ll128)v);
      pMVar5 = pMVar5 + 1;
      lVar10 = lVar10 + 0x200;
    }
    pMVar5 = pMVar6;
  }
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~vector(&out_files);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&coefficients.super__Vector_base<long_long,_std::allocator<long_long>_>);
  return pMVar5;
}

Assistant:

Mat* IOManager::secret_share_ngram(int* data, int size, string prefix) {
    vector<ll> coefficients(TN);
    vector<ofstream> out_files(M);
    cout << prefix << " size: " << size << endl;

    Mat* res = new Mat[M];
//    Mat res(1, size);
    for (int i = 0; i < M; ++i) {
        res[i].init(1, size);
        string filename = "output/"+prefix+"_"+to_string(i)+".csv";
        cout << "File: " << filename << endl;
        out_files[i].open(filename, ios::out);
    }
    /// 简化计算，TODO，delete
    for (int j = 1; j < TN; ++j) {
        coefficients[j] = Constant::Util::randomlong();
    }
//    for (int j = 0; j < TN; ++j) {
//        cout << j << ": " << coefficients[j] << endl;
//    }
    cout << "Size: " << size << endl;
//    srand(time(0));
    for (int i = 0; i < size; ++i) {
        for (int j = 1; j < TN; ++j) {
            coefficients[j] = Constant::Util::randomlong();
        }
        coefficients[0] = data[i]*IE;
        for (int k = 0; k < M; ++k) {
            ll tmp = poly_eval(coefficients, k + 2);
            out_files[k] << tmp << ",";
            res[k].setVal(i, tmp);
//            if(k==node_type){
//                res.setVal(i, tmp);
//            }
        }
//        for (int l = 0; l < TN; ++l) {
//            DBGprint("%lld, ", coefficients[l]);
//        }
//        cout << endl;
    }
//    res[0].print();
    return res;
}